

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::AutoCloseFd> __thiscall
kj::
NoInfer_<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1834:30)>
::Type::operator()(void *this,Maybe<kj::AutoCloseFd> *result)

{
  AutoCloseFd *other;
  char (*in_RCX) [41];
  Maybe<kj::AutoCloseFd> *in_RDX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar1;
  Promise<kj::AutoCloseFd> PVar2;
  String local_1b0;
  Exception local_198;
  AutoCloseFd local_30;
  AutoCloseFd *local_28;
  AutoCloseFd *r;
  Maybe<kj::AutoCloseFd> *result_local;
  Type *this_local;
  
  result_local = result;
  this_local = (Type *)this;
  local_28 = _::readMaybe<kj::AutoCloseFd>(in_RDX);
  if (local_28 == (AutoCloseFd *)0x0) {
    _::Debug::makeDescription<char_const(&)[41]>
              (&local_1b0,(Debug *)"\"EOF when expecting to receive capability\"",
               "EOF when expecting to receive capability",in_RCX);
    Exception::Exception
              (&local_198,FAILED,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x72e,&local_1b0);
    Promise<kj::AutoCloseFd>::Promise((Promise<kj::AutoCloseFd> *)this,&local_198);
    Exception::~Exception(&local_198);
    String::~String(&local_1b0);
    pPVar1 = extraout_RDX_00;
  }
  else {
    other = mv<kj::AutoCloseFd>(local_28);
    AutoCloseFd::AutoCloseFd(&local_30,other);
    Promise<kj::AutoCloseFd>::Promise((Promise<kj::AutoCloseFd> *)this,&local_30);
    AutoCloseFd::~AutoCloseFd(&local_30);
    pPVar1 = extraout_RDX;
  }
  PVar2.super_PromiseBase.node.ptr = pPVar1;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::AutoCloseFd>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<AutoCloseFd> AsyncCapabilityStream::receiveFd() {
  return tryReceiveFd().then([](Maybe<AutoCloseFd>&& result) -> Promise<AutoCloseFd> {
    KJ_IF_MAYBE(r, result) {
      return kj::mv(*r);
    } else {
      return KJ_EXCEPTION(FAILED, "EOF when expecting to receive capability");
    }
  });
}